

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall wabt::interp::Thread::PushCall(Thread *this,HostFunc *func,Ptr *out_trap)

{
  RunResult RVar1;
  int local_1c;
  unsigned_long local_18;
  unsigned_long local_10;
  Ref local_8;
  
  if ((this->frames_).super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (this->frames_).super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    PushCall();
    RVar1 = Trap;
  }
  else {
    this->inst_ = (Instance *)0x0;
    this->mod_ = (Module *)0x0;
    local_8.index = (func->super_Func).super_Extern.super_Object.self_.index;
    local_10 = (long)(this->values_).
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->values_).
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 4;
    local_18 = (long)(this->exceptions_).
                     super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->exceptions_).
                     super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
    local_1c = 0;
    std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>::
    emplace_back<wabt::interp::Ref,unsigned_long,unsigned_long,int,wabt::interp::Instance*&,wabt::interp::Module*&>
              ((vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>> *)this,&local_8,
               &local_10,&local_18,&local_1c,&this->inst_,&this->mod_);
    RVar1 = Ok;
  }
  return RVar1;
}

Assistant:

RunResult Thread::PushCall(const HostFunc& func, Trap::Ptr* out_trap) {
  TRAP_IF(frames_.size() == frames_.capacity(), "call stack exhausted");
  inst_ = nullptr;
  mod_ = nullptr;
  frames_.emplace_back(func.self(), values_.size(), exceptions_.size(), 0,
                       inst_, mod_);
  return RunResult::Ok;
}